

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddConvexCollisionModel
               (shared_ptr<chrono::ChBody> *body,shared_ptr<chrono::ChMaterialSurface> *material,
               shared_ptr<chrono::geometry::ChTriangleMeshConnected> *convex_mesh,
               vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
               *convex_hulls,ChVector<double> *pos,ChQuaternion<double> *rot,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  pointer pvVar1;
  element_type *this;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChTriangleMeshShape *this_00;
  ulong uVar4;
  element_type *peVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  ChVector<double> *local_140;
  ChQuaternion<double> *local_138;
  shared_ptr<chrono::ChVisualShape> local_130;
  shared_ptr<chrono::ChVisualMaterial> local_120;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_110;
  undefined1 local_100 [48];
  element_type *local_d0;
  ChSystem *local_c8;
  element_type *local_c0;
  ChFrame<double> local_b8;
  
  local_140 = pos;
  local_138 = rot;
  local_100._32_8_ = convex_mesh;
  local_100._40_8_ = material;
  if ((convex_hulls->
      super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (convex_hulls->
      super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      peVar5 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d0 = (peVar5->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      p_Var3 = (peVar5->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      local_100._16_8_ =
           ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)local_100._40_8_)
           ->_M_ptr;
      local_100._24_8_ =
           (((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)local_100._40_8_
            )->_M_refcount)._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_)->_M_use_count + 1;
        }
      }
      pvVar1 = (convex_hulls->
               super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b8,local_138);
      (*local_d0->_vptr_ChCollisionModel[0xf])
                (local_d0,local_100 + 0x10,
                 (long)&(pvVar1->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar6,local_140,&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_);
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      uVar4 = uVar4 + 1;
      uVar2 = ((long)(convex_hulls->
                     super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(convex_hulls->
                     super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar6 = lVar6 + 0x18;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  peVar5 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ChPhysicsItem::GetVisualModel(&peVar5->super_ChPhysicsItem);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._vptr_ChFrame ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    local_100._0_8_ = p_Var3 + 1;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[2]._M_weak_count = 0;
    p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[2]._M_weak_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[3]._M_weak_count = 0;
    this = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = 2;
    }
    peVar5 = (element_type *)local_100;
    local_100._8_8_ = p_Var3;
    ChPhysicsItem::AddVisualModel
              (&this->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)peVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)peVar5)
  ;
  ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_148,this_00);
  local_110.
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)local_100._32_8_;
  local_110.
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100._32_8_ + 8))->_M_pi;
  if (local_110.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_110.
       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_110.
       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChTriangleMeshShape::SetMesh(this_00,&local_110,true);
  if (local_110.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__cxx11::string::_M_assign((string *)&this_00->name);
  local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChVisualShape::AddMaterial((ChVisualShape *)this_00,&local_120);
  if (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ChPhysicsItem::GetVisualModel
            (&((body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChPhysicsItem);
  local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_148._M_pi;
  if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
    }
  }
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b8.coord.pos.m_data[0] = local_140->m_data[0];
  local_b8.coord.pos.m_data[1] = local_140->m_data[1];
  local_b8.coord.pos.m_data[2] = local_140->m_data[2];
  local_b8.coord.rot.m_data[0] = local_138->m_data[0];
  local_b8.coord.rot.m_data[1] = local_138->m_data[1];
  local_b8.coord.rot.m_data[2] = local_138->m_data[2];
  local_b8.coord.rot.m_data[3] = local_138->m_data[3];
  local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,local_138);
  ChVisualModel::AddShape((ChVisualModel *)local_c8,&local_130,&local_b8);
  if (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0);
  }
  if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148._M_pi);
  }
  return;
}

Assistant:

void AddConvexCollisionModel(std::shared_ptr<ChBody> body,
                             std::shared_ptr<ChMaterialSurface> material,
                             std::shared_ptr<ChTriangleMeshConnected> convex_mesh,
                             std::vector<std::vector<ChVector<double>>>& convex_hulls,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int c = 0; c < convex_hulls.size(); c++) {
        body->GetCollisionModel()->AddConvexHull(material, convex_hulls[c], pos, rot);
    }

    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    // Add the original triangle mesh as asset
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(convex_mesh);
    trimesh_shape->SetName(convex_mesh->GetFileName());
    trimesh_shape->AddMaterial(vis_material);
    body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>(pos, rot));
}